

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestExtensionOrderings2_TestExtensionOrderings3::_InternalSerialize
          (TestExtensionOrderings2_TestExtensionOrderings3 *this,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  string_view s;
  TestExtensionOrderings2_TestExtensionOrderings3 *this_00;
  bool bVar1;
  int size;
  uint32_t *puVar2;
  char *data;
  UnknownFieldSet *unknown_fields;
  string_view local_48;
  string *local_38;
  string *_s;
  TestExtensionOrderings2_TestExtensionOrderings3 *pTStack_28;
  uint32_t cached_has_bits;
  TestExtensionOrderings2_TestExtensionOrderings3 *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestExtensionOrderings2_TestExtensionOrderings3 *this_local;
  
  _s._4_4_ = 0;
  pTStack_28 = this;
  this_ = (TestExtensionOrderings2_TestExtensionOrderings3 *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar2;
  if ((_s._4_4_ & 1) != 0) {
    local_38 = _internal_my_string_abi_cxx11_(pTStack_28);
    data = (char *)std::__cxx11::string::data();
    size = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"proto2_unittest.TestExtensionOrderings2.TestExtensionOrderings3.my_string"
              );
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(data,size,SERIALIZE,local_48)
    ;
    this_00 = this_;
    s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)this_00,1,s,(uint8_t *)stream_local);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(pTStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pTStack_28->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestExtensionOrderings2_TestExtensionOrderings3::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestExtensionOrderings2_TestExtensionOrderings3& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestExtensionOrderings2.TestExtensionOrderings3)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // string my_string = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_my_string();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestExtensionOrderings2.TestExtensionOrderings3.my_string");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestExtensionOrderings2.TestExtensionOrderings3)
  return target;
}